

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::createInvertedSwizzle
          (TGlslangToSpvTraverser *this,Decoration precision,TIntermTyped *node,Id parentResult)

{
  int iVar1;
  Id IVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  bool forwardReferenceOnly;
  undefined1 auVar4 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> swizzle;
  undefined1 local_48 [16];
  pointer local_38;
  
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (TString *)0x0;
  local_38 = (pointer)0x0;
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x14])(node);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x198))
                             ((long *)CONCAT44(extraout_var,iVar1));
  auVar4 = (**(code **)(*plVar3 + 0x30))(plVar3);
  convertSwizzle(auVar4._0_8_,(TIntermAggregate *)local_48,auVar4._8_8_);
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  IVar2 = convertGlslangToSpvType
                    (this,(TType *)CONCAT44(extraout_var_00,iVar1),forwardReferenceOnly);
  IVar2 = spv::Builder::createRvalueSwizzle
                    (&this->builder,precision,IVar2,parentResult,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  if ((_func_int **)local_48._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
  }
  return IVar2;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createInvertedSwizzle(spv::Decoration precision, const glslang::TIntermTyped& node,
    spv::Id parentResult)
{
    std::vector<unsigned> swizzle;
    convertSwizzle(*node.getAsBinaryNode()->getRight()->getAsAggregate(), swizzle);
    return builder.createRvalueSwizzle(precision, convertGlslangToSpvType(node.getType()), parentResult, swizzle);
}